

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary_impl.hpp
# Opt level: O1

void __thiscall
ylt::metric::detail::summary_impl<unsigned_long,_6UL>::~summary_impl
          (summary_impl<unsigned_long,_6UL> *this)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  
  lVar3 = 0x18;
  do {
    pvVar1 = *(void **)((long)((this->data_)._M_elems + -3) + lVar3);
    if (pvVar1 != (void *)0x0) {
      lVar2 = 0;
      do {
        if (*(void **)((long)pvVar1 + lVar2) != (void *)0x0) {
          operator_delete(*(void **)((long)pvVar1 + lVar2),0x400);
        }
        lVar2 = lVar2 + 8;
      } while (lVar2 != 0x400);
      operator_delete(pvVar1,0x400);
    }
    lVar3 = lVar3 + 8;
  } while (lVar3 != 0x28);
  return;
}

Assistant:

~summary_impl() {
    for (auto& data : data_) {
      delete data;
    }
  }